

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O0

void Omega_h::correct_integral_errors(Mesh *mesh,AdaptOpts *opts)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  Int IVar4;
  TransferOpts *opts_00;
  TagBase *tag;
  string *psVar5;
  allocator local_139;
  string local_138 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  string local_f8 [8];
  string density_name;
  TagBase *tagbase_2;
  undefined1 local_c8 [4];
  Int tagi_2;
  TagBase *local_a8;
  TagBase *tagbase_1;
  undefined1 local_98 [4];
  Int tagi_1;
  TagBase *local_78;
  TagBase *tagbase;
  Int local_68;
  Int tagi;
  Int dim;
  undefined1 local_58 [8];
  Reals elem_sizes;
  Graph diffusion_graph;
  bool verbose;
  TransferOpts *xfer_opts;
  AdaptOpts *opts_local;
  Mesh *mesh_local;
  
  opts_00 = &opts->xfer_opts;
  bVar2 = should_conserve_any(mesh,opts_00);
  if (bVar2) {
    begin_code("correct_integral_errors",(char *)0x0);
    Mesh::set_parting(mesh,OMEGA_H_GHOSTED,false);
    bVar2 = 0 < (int)opts->verbosity;
    get_elem_diffusion_graph((Graph *)&elem_sizes.write_.shared_alloc_.direct_ptr,mesh);
    Mesh::ask_sizes((Mesh *)local_58);
    local_68 = Mesh::dim(mesh);
    for (tagbase._4_4_ = 0; iVar1 = tagbase._4_4_, IVar4 = Mesh::ntags(mesh,local_68), iVar1 < IVar4
        ; tagbase._4_4_ = tagbase._4_4_ + 1) {
      local_78 = Mesh::get_tag(mesh,local_68,tagbase._4_4_);
      bVar3 = should_conserve(mesh,opts_00,local_68,local_78);
      if (bVar3) {
        Graph::Graph((Graph *)local_98,(Graph *)&elem_sizes.write_.shared_alloc_.direct_ptr);
        correct_density_error(mesh,opts_00,(Graph *)local_98,local_78,bVar2);
        Graph::~Graph((Graph *)local_98);
      }
    }
    for (tagbase_1._4_4_ = 0; iVar1 = tagbase_1._4_4_, IVar4 = Mesh::ntags(mesh,0), iVar1 < IVar4;
        tagbase_1._4_4_ = tagbase_1._4_4_ + 1) {
      local_a8 = Mesh::get_tag(mesh,0,tagbase_1._4_4_);
      bVar3 = is_momentum_velocity(mesh,opts_00,0,local_a8);
      if (bVar3) {
        Graph::Graph((Graph *)local_c8,(Graph *)&elem_sizes.write_.shared_alloc_.direct_ptr);
        correct_momentum_error(mesh,opts_00,(Graph *)local_c8,local_a8,bVar2);
        Graph::~Graph((Graph *)local_c8);
      }
    }
    for (tagbase_2._4_4_ = 0; IVar4 = Mesh::ntags(mesh,local_68), tagbase_2._4_4_ < IVar4;
        tagbase_2._4_4_ = tagbase_2._4_4_ + 1) {
      tag = Mesh::get_tag(mesh,local_68,tagbase_2._4_4_);
      bVar2 = should_conserve(mesh,opts_00,local_68,tag);
      if (bVar2) {
        psVar5 = TagBase::name_abi_cxx11_(tag);
        std::__cxx11::string::string(local_f8,(string *)psVar5);
        IVar4 = local_68;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_138,"old_",&local_139);
        std::operator+(local_118,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138);
        Mesh::remove_tag(mesh,IVar4,local_118);
        std::__cxx11::string::~string((string *)local_118);
        std::__cxx11::string::~string(local_138);
        std::allocator<char>::~allocator((allocator<char> *)&local_139);
        std::__cxx11::string::~string(local_f8);
      }
    }
    end_code();
    Read<double>::~Read((Read<double> *)local_58);
    Graph::~Graph((Graph *)&elem_sizes.write_.shared_alloc_.direct_ptr);
  }
  return;
}

Assistant:

void correct_integral_errors(Mesh* mesh, AdaptOpts const& opts) {
  auto& xfer_opts = opts.xfer_opts;
  if (!should_conserve_any(mesh, xfer_opts)) return;
  begin_code("correct_integral_errors");
  mesh->set_parting(OMEGA_H_GHOSTED);
  auto verbose = opts.verbosity > SILENT;
  auto diffusion_graph = get_elem_diffusion_graph(mesh);
  auto elem_sizes = mesh->ask_sizes();
  auto dim = mesh->dim();
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      correct_density_error(mesh, xfer_opts, diffusion_graph, tagbase, verbose);
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(VERT); ++tagi) {
    auto tagbase = mesh->get_tag(VERT, tagi);
    if (is_momentum_velocity(mesh, xfer_opts, VERT, tagbase)) {
      correct_momentum_error(
          mesh, xfer_opts, diffusion_graph, tagbase, verbose);
    }
  }
  for (Int tagi = 0; tagi < mesh->ntags(dim); ++tagi) {
    auto tagbase = mesh->get_tag(dim, tagi);
    if (should_conserve(mesh, xfer_opts, dim, tagbase)) {
      auto density_name = tagbase->name();
      mesh->remove_tag(dim, std::string("old_") + density_name);
    }
  }
  end_code();
}